

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O3

bool __thiscall
SuperCardPro::SendCmd(SuperCardPro *this,uint8_t cmd,void *buf,int len,void *bulkbuf,int bulklen)

{
  bool bVar1;
  int iVar2;
  exception *this_00;
  ulong uVar3;
  char cVar4;
  undefined7 in_register_00000031;
  char *pcVar5;
  size_t __n;
  int iVar6;
  uint uVar7;
  uint8_t *p;
  int bytes_read;
  uint8_t result [2];
  Data data;
  int local_54;
  char local_4e;
  uint8_t local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_4c = (uint)CONCAT71(in_register_00000031,cmd);
  if (len < 1) {
    cVar4 = 'J';
  }
  else {
    cVar4 = 'J';
    uVar3 = 0;
    do {
      cVar4 = cVar4 + *(char *)((long)buf + uVar3);
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_48,(long)(len + 3),(allocator_type *)&local_54);
  *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = (uchar)local_4c;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = (uchar)len;
  if (len == 0) {
    __n = 0;
  }
  else {
    __n = (size_t)len;
    memcpy(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 2,buf,__n);
  }
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[__n + 2] =
       cVar4 + *local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start +
       local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  bVar1 = WriteExact(this,local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                     (int)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                     (int)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    cVar4 = (char)local_4c;
    if (cVar4 == -0x57) {
      local_54 = 0;
      if (0 < bulklen) {
        do {
          iVar2 = (*this->_vptr_SuperCardPro[2])(this,bulkbuf,(ulong)(uint)bulklen,&local_54);
          if ((char)iVar2 == '\0') goto LAB_0016fda5;
          bulkbuf = (void *)((long)bulkbuf + (long)local_54);
          uVar7 = bulklen - local_54;
          bVar1 = local_54 <= bulklen;
          bulklen = uVar7;
        } while (uVar7 != 0 && bVar1);
      }
    }
    else if (((local_4c & 0xff) == 0xaa) && (bVar1 = WriteExact(this,bulkbuf,bulklen), !bVar1))
    goto LAB_0016fda5;
    local_54 = 0;
    uVar3 = 2;
    pcVar5 = &local_4e;
    do {
      iVar6 = (int)uVar3;
      iVar2 = (*this->_vptr_SuperCardPro[2])(this,pcVar5,uVar3,&local_54);
      if ((char)iVar2 == '\0') goto LAB_0016fda5;
      pcVar5 = pcVar5 + local_54;
      uVar7 = iVar6 - local_54;
      uVar3 = (ulong)uVar7;
    } while (uVar7 != 0 && local_54 <= iVar6);
    if (local_4e != cVar4) {
      this_00 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[28]>
                (this_00,(char (*) [28])"SCP result command mismatch");
      __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_4d == 'O') {
      this->m_error = 'O';
      bVar1 = true;
      goto LAB_0016fda7;
    }
    this->m_error = local_4d;
  }
LAB_0016fda5:
  bVar1 = false;
LAB_0016fda7:
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SuperCardPro::SendCmd(uint8_t cmd, void* buf, int len, void* bulkbuf, int bulklen)
{
    auto p = reinterpret_cast<uint8_t*>(buf);
    uint8_t datasum = CHECKSUM_INIT;
    for (auto i = 0; i < len; ++i)
        datasum += p[i];

    Data data(2 + len + 1);
    data[0] = cmd;
    data[1] = static_cast<uint8_t>(len);
    if (len) memcpy(&data[2], buf, len);
    data[2 + len] = data[0] + data[1] + datasum;

    if (!WriteExact(&data[0], data.size()))
        return false;

    if (cmd == CMD_LOADRAM_USB && !WriteExact(bulkbuf, bulklen))
        return false;
    else if (cmd == CMD_SENDRAM_USB && !ReadExact(bulkbuf, bulklen))
        return false;

    uint8_t result[2];
    if (!ReadExact(result, sizeof(result)))
        return false;

    if (result[0] != cmd)
        throw util::exception("SCP result command mismatch");

    if (result[1] != pr_Ok)
    {
        m_error = result[1];
        return false;
    }

    m_error = result[1];    // pr_Ok
    return true;
}